

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

bool computeDualObjectiveValue(HighsLp *lp,HighsSolution *solution,double *dual_objective_value)

{
  double dVar1;
  double dVar2;
  int iVar3;
  const_reference pvVar4;
  double *in_RDX;
  long in_RSI;
  int *in_RDI;
  double mid;
  double upper;
  double lower;
  double dual;
  double primal;
  HighsInt iRow;
  bool is_col;
  HighsInt iVar;
  double bound;
  double local_88;
  double local_80;
  int local_2c;
  double local_28;
  bool local_1;
  
  *in_RDX = 0.0;
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    local_1 = false;
  }
  else {
    *in_RDX = *(double *)(in_RDI + 0x3e);
    for (local_2c = 0; local_2c < *in_RDI + in_RDI[1]; local_2c = local_2c + 1) {
      iVar3 = local_2c - *in_RDI;
      if (local_2c < *in_RDI) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)local_2c);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)local_2c);
        dVar2 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_2c);
        local_88 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_2c
                           );
        local_80 = *pvVar4;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x38),(long)iVar3);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),(long)iVar3);
        dVar2 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),(long)iVar3);
        local_88 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),(long)iVar3);
        local_80 = *pvVar4;
      }
      if ((-INFINITY < local_88) || (local_80 < INFINITY)) {
        if ((local_88 + local_80) * 0.5 <= dVar1) {
          local_88 = local_80;
        }
        local_28 = local_88;
      }
      else {
        local_28 = 1.0;
      }
      *in_RDX = local_28 * dVar2 + *in_RDX;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool computeDualObjectiveValue(const HighsLp& lp, const HighsSolution& solution,
                               double& dual_objective_value) {
  dual_objective_value = 0;
  if (!solution.dual_valid) return false;
  // #2184 Make sure that the solution corresponds to this LP
  assert(solution.col_value.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.col_dual.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.row_value.size() == static_cast<size_t>(lp.num_row_));
  assert(solution.row_dual.size() == static_cast<size_t>(lp.num_row_));

  dual_objective_value = lp.offset_;
  double bound = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      bound = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      bound = primal < mid ? lower : upper;
    }
    dual_objective_value += bound * dual;
  }
  return true;
}